

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

int32 rw::ps2::getSizeNativeData(void *object,int32 param_2,int32 param_3)

{
  InstanceData *instance;
  uint32 i;
  InstanceDataHeader *header;
  int32 size;
  Geometry *geometry;
  int32 param_2_local;
  int32 param_1_local;
  void *object_local;
  
  header._4_4_ = 0x10;
  if ((*(long *)((long)object + 0x98) == 0) || (**(int **)((long)object + 0x98) != 4)) {
    object_local._4_4_ = 0;
  }
  else {
    for (instance._4_4_ = 0; instance._4_4_ < *(uint *)(*(long *)((long)object + 0x98) + 4);
        instance._4_4_ = instance._4_4_ + 1) {
      header._4_4_ = *(int *)(*(long *)(*(long *)((long)object + 0x98) + 8) +
                             (ulong)instance._4_4_ * 0x20) + header._4_4_ + 8;
    }
    object_local._4_4_ = header._4_4_;
  }
  return object_local._4_4_;
}

Assistant:

int32
getSizeNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	int32 size = 16;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_PS2)
		return 0;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	for(uint32 i = 0; i < header->numMeshes; i++){
		InstanceData *instance = &header->instanceMeshes[i];
		size += 8;
		size += instance->dataSize;
	}
	return size;
}